

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O3

void __thiscall
CoreML::Specification::BiDirectionalLSTMLayerParams::BiDirectionalLSTMLayerParams
          (BiDirectionalLSTMLayerParams *this,BiDirectionalLSTMLayerParams *from)

{
  void *pvVar1;
  LSTMParams *from_00;
  uint64 uVar2;
  LSTMParams *this_00;
  
  (this->super_MessageLite)._vptr_MessageLite =
       (_func_int **)&PTR__BiDirectionalLSTMLayerParams_00701c68;
  (this->_internal_metadata_).
  super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
  .ptr_ = (void *)0x0;
  (this->activationsforwardlstm_).super_RepeatedPtrFieldBase.arena_ = (Arena *)0x0;
  (this->activationsforwardlstm_).super_RepeatedPtrFieldBase.current_size_ = 0;
  (this->activationsforwardlstm_).super_RepeatedPtrFieldBase.total_size_ = 0;
  (this->activationsforwardlstm_).super_RepeatedPtrFieldBase.rep_ = (Rep *)0x0;
  google::protobuf::internal::RepeatedPtrFieldBase::
  MergeFrom<google::protobuf::RepeatedPtrField<CoreML::Specification::ActivationParams>::TypeHandler>
            (&(this->activationsforwardlstm_).super_RepeatedPtrFieldBase,
             &(from->activationsforwardlstm_).super_RepeatedPtrFieldBase);
  (this->activationsbackwardlstm_).super_RepeatedPtrFieldBase.arena_ = (Arena *)0x0;
  (this->activationsbackwardlstm_).super_RepeatedPtrFieldBase.current_size_ = 0;
  (this->activationsbackwardlstm_).super_RepeatedPtrFieldBase.total_size_ = 0;
  (this->activationsbackwardlstm_).super_RepeatedPtrFieldBase.rep_ = (Rep *)0x0;
  google::protobuf::internal::RepeatedPtrFieldBase::
  MergeFrom<google::protobuf::RepeatedPtrField<CoreML::Specification::ActivationParams>::TypeHandler>
            (&(this->activationsbackwardlstm_).super_RepeatedPtrFieldBase,
             &(from->activationsbackwardlstm_).super_RepeatedPtrFieldBase);
  (this->weightparams_).super_RepeatedPtrFieldBase.arena_ = (Arena *)0x0;
  (this->weightparams_).super_RepeatedPtrFieldBase.current_size_ = 0;
  (this->weightparams_).super_RepeatedPtrFieldBase.total_size_ = 0;
  (this->weightparams_).super_RepeatedPtrFieldBase.rep_ = (Rep *)0x0;
  google::protobuf::internal::RepeatedPtrFieldBase::
  MergeFrom<google::protobuf::RepeatedPtrField<CoreML::Specification::LSTMWeightParams>::TypeHandler>
            (&(this->weightparams_).super_RepeatedPtrFieldBase,
             &(from->weightparams_).super_RepeatedPtrFieldBase);
  this->_cached_size_ = 0;
  pvVar1 = (from->_internal_metadata_).
           super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
           .ptr_;
  if (((ulong)pvVar1 & 1) != 0) {
    google::protobuf::internal::InternalMetadataWithArenaLite::DoMergeFrom
              (&this->_internal_metadata_,(string *)((ulong)pvVar1 & 0xfffffffffffffffe));
  }
  from_00 = from->params_;
  if (from_00 == (LSTMParams *)0x0 ||
      from == (BiDirectionalLSTMLayerParams *)&_BiDirectionalLSTMLayerParams_default_instance_) {
    this_00 = (LSTMParams *)0x0;
  }
  else {
    this_00 = (LSTMParams *)operator_new(0x20);
    LSTMParams::LSTMParams(this_00,from_00);
  }
  this->params_ = this_00;
  uVar2 = from->outputvectorsize_;
  this->inputvectorsize_ = from->inputvectorsize_;
  this->outputvectorsize_ = uVar2;
  return;
}

Assistant:

BiDirectionalLSTMLayerParams::BiDirectionalLSTMLayerParams(const BiDirectionalLSTMLayerParams& from)
  : ::google::protobuf::MessageLite(),
      _internal_metadata_(NULL),
      activationsforwardlstm_(from.activationsforwardlstm_),
      activationsbackwardlstm_(from.activationsbackwardlstm_),
      weightparams_(from.weightparams_),
      _cached_size_(0) {
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  if (from.has_params()) {
    params_ = new ::CoreML::Specification::LSTMParams(*from.params_);
  } else {
    params_ = NULL;
  }
  ::memcpy(&inputvectorsize_, &from.inputvectorsize_,
    reinterpret_cast<char*>(&outputvectorsize_) -
    reinterpret_cast<char*>(&inputvectorsize_) + sizeof(outputvectorsize_));
  // @@protoc_insertion_point(copy_constructor:CoreML.Specification.BiDirectionalLSTMLayerParams)
}